

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.hpp
# Opt level: O2

int __thiscall qclab::qgates::SWAP<double>::toQASM(SWAP<double> *this,ostream *stream,int offset)

{
  int in_ECX;
  __string_type local_30;
  
  qasmSWAP_abi_cxx11_(&local_30,(qclab *)(ulong)(uint)((this->qubits_)._M_elems[0] + offset),
                      offset + (this->qubits_)._M_elems[1],in_ECX);
  std::operator<<(stream,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return 0;
}

Assistant:

int toQASM( std::ostream& stream ,
                    const int offset = 0 ) const override {
          stream << qasmSWAP( qubits_[0] + offset , qubits_[1] + offset ) ;
          return 0 ;
        }